

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

int F(opt_state_t *opt_state,int code,int v0,int v1)

{
  valnode *pvVar1;
  int iVar2;
  uint uVar3;
  valnode *local_38;
  valnode *p;
  int val;
  u_int hash;
  int v1_local;
  int v0_local;
  int code_local;
  opt_state_t *opt_state_local;
  
  uVar3 = (uint)(code ^ v0 << 4 ^ v1 << 8) % 0xd5;
  local_38 = opt_state->hashtbl[uVar3];
  while( true ) {
    if (local_38 == (valnode *)0x0) {
      iVar2 = opt_state->curval + 1;
      opt_state->curval = iVar2;
      if (((code & 0xe0U) == 0) && (((code & 7U) == 0 || ((code & 7U) == 1)))) {
        opt_state->vmap[iVar2].const_val = v0;
        opt_state->vmap[iVar2].is_const = 1;
      }
      pvVar1 = opt_state->next_vnode;
      opt_state->next_vnode = pvVar1 + 1;
      pvVar1->val = iVar2;
      pvVar1->code = code;
      pvVar1->v0 = v0;
      pvVar1->v1 = v1;
      pvVar1->next = opt_state->hashtbl[uVar3];
      opt_state->hashtbl[uVar3] = pvVar1;
      return iVar2;
    }
    if (((local_38->code == code) && (local_38->v0 == v0)) && (local_38->v1 == v1)) break;
    local_38 = local_38->next;
  }
  return local_38->val;
}

Assistant:

static int
F(opt_state_t *opt_state, int code, int v0, int v1)
{
	u_int hash;
	int val;
	struct valnode *p;

	hash = (u_int)code ^ (v0 << 4) ^ (v1 << 8);
	hash %= MODULUS;

	for (p = opt_state->hashtbl[hash]; p; p = p->next)
		if (p->code == code && p->v0 == v0 && p->v1 == v1)
			return p->val;

	val = ++opt_state->curval;
	if (BPF_MODE(code) == BPF_IMM &&
	    (BPF_CLASS(code) == BPF_LD || BPF_CLASS(code) == BPF_LDX)) {
		opt_state->vmap[val].const_val = v0;
		opt_state->vmap[val].is_const = 1;
	}
	p = opt_state->next_vnode++;
	p->val = val;
	p->code = code;
	p->v0 = v0;
	p->v1 = v1;
	p->next = opt_state->hashtbl[hash];
	opt_state->hashtbl[hash] = p;

	return val;
}